

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Box.cpp
# Opt level: O2

bool __thiscall Box::intersect(Box *this,Ray *r,double *t)

{
  Vector *v;
  bool bVar1;
  long lVar2;
  long lVar3;
  double *pdVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  double local_50;
  double local_48;
  
  BoxTestCount = BoxTestCount + 1;
  pdVar4 = this->d2;
  local_50 = -INFINITY;
  local_48 = INFINITY;
  for (lVar3 = 0; lVar3 != 0x48; lVar3 = lVar3 + 0x18) {
    v = (Vector *)((long)&this->n[0].x + lVar3);
    dVar5 = operator&(&r->dir,v);
    dVar6 = operator&(&r->org,v);
    if (dVar5 <= 0.01) {
      dVar7 = pdVar4[-3];
      lVar2 = 0x160;
      if (dVar5 < -0.01) goto LAB_00104726;
      if ((dVar6 < dVar7) || (*pdVar4 <= dVar6 && dVar6 != *pdVar4)) goto LAB_001047c1;
    }
    else {
      dVar7 = *pdVar4;
      lVar2 = 0x148;
LAB_00104726:
      dVar8 = -(*(double *)((long)pdVar4 + lVar2 + -0x160) + dVar6) / dVar5;
      if ((dVar8 < local_48) && (local_48 = dVar8, dVar8 < geom_threshold)) goto LAB_001047c1;
      dVar5 = -(dVar6 + dVar7) / dVar5;
      if (dVar5 <= local_50) {
        dVar5 = local_50;
      }
      local_50 = dVar5;
      if (local_48 < dVar5) goto LAB_001047c1;
    }
    pdVar4 = pdVar4 + 1;
  }
  *t = local_50;
  bVar1 = true;
  if (local_50 <= geom_threshold) {
LAB_001047c1:
    BoxTestMisses = BoxTestMisses + 1;
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool Box::intersect(Ray& r, double& t)
{
    STAT(BoxTestCount++);

    double tNear = -INFINITY;
    double tFar  = INFINITY;
    double t1,t2;
    double vd,vo;
    int i;

    for( i = 0; i < 3; i++ )
    {
        vd = r.dir & n[i];
        vo = r.org & n[i];

        if( vd > EPS )
        {
            t1 = -(vo + d2[i]) / vd;
            t2 = -(vo + d1[i]) / vd;
        }
        else
        if(vd < -EPS)
        {
            t1 = -(vo + d1[i]) / vd;
            t2 = -(vo + d2[i]) / vd;
        }
        else // ray is parallel to slab
        {
            if( vo < d1[i] || vo > d2[i] )
            {
                STAT(BoxTestMisses++);
                return false;
            }
            else
                continue;
        }
        if( t1 > tNear )
            tNear = t1;
        if( t2 < tFar )
            if( (tFar = t2) < geom_threshold )
            {
                STAT(BoxTestMisses++);
                return false;
            }
        if( tNear > tFar )
        {
            STAT(BoxTestMisses++);
            return false;
        }
    }
    t = tNear;
    if( t > geom_threshold )
        return true;
    else
    {
        STAT(BoxTestMisses++);
        return false;
    }
}